

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  iterator __position;
  bool bVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  int iVar6;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> subExpr;
  string local_90;
  cmExpandedCommandArgument local_70;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_48;
  
  p_Var1 = (newArgs->
           super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var1 == (_List_node_base *)newArgs) {
      return true;
    }
    keyword.super_string_view._M_str = DAT_009669f0;
    keyword.super_string_view._M_len = (anonymous_namespace)::keyParenL;
    bVar3 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)((long)p_Var1 + 0x10U));
    if (bVar3) {
      p_Var5 = p_Var1->_M_next;
      if (p_Var5 == (_List_node_base *)newArgs) {
LAB_0052a117:
        std::__cxx11::string::_M_replace
                  ((ulong)errorString,0,(char *)errorString->_M_string_length,0x792ec2);
        *status = FATAL_ERROR;
        return false;
      }
      iVar6 = 1;
      do {
        keyword_00.super_string_view._M_str = DAT_009669f0;
        keyword_00.super_string_view._M_len = (anonymous_namespace)::keyParenL;
        bVar3 = IsKeyword(this,keyword_00,(cmExpandedCommandArgument *)(p_Var5 + 1));
        keyword_01.super_string_view._M_str = DAT_00966a00;
        keyword_01.super_string_view._M_len = (anonymous_namespace)::keyParenR;
        bVar4 = IsKeyword(this,keyword_01,(cmExpandedCommandArgument *)(p_Var5 + 1));
        iVar6 = (iVar6 + (uint)bVar3) - (uint)bVar4;
        p_Var5 = p_Var5->_M_next;
        if (p_Var5 == (_List_node_base *)newArgs) break;
      } while (iVar6 != 0);
      if (iVar6 != 0) goto LAB_0052a117;
      std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
      vector<std::_List_iterator<cmExpandedCommandArgument>,void>
                ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                 &local_48,p_Var1->_M_next,p_Var5->_M_prev,(allocator_type *)&local_70);
      IsTrue(this,&local_48,errorString,status);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
      cmExpandedCommandArgument::cmExpandedCommandArgument(&local_70,&local_90,true);
      std::__cxx11::string::operator=((string *)((long)p_Var1 + 0x10U),(string *)&local_70);
      *(bool *)&(((cmArgumentList *)((long)p_Var1 + 0x30))->
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
                super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl._M_node.super__List_node_base._M_next = local_70.Quoted;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.Value._M_dataplus._M_p != &local_70.Value.field_2) {
        operator_delete(local_70.Value._M_dataplus._M_p,
                        local_70.Value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      __position._M_node = p_Var1->_M_next;
      while (__position._M_node != p_Var5) {
        p_Var2 = (__position._M_node)->_M_next;
        std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        _M_erase(&newArgs->
                  super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>,
                 __position);
        __position._M_node = p_Var2;
      }
      std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
                (&local_48);
    }
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto arg = newArgs.begin(); arg != newArgs.end(); ++arg) {
    if (this->IsKeyword(keyParenL, *arg)) {
      // search for the closing paren for this opening one
      auto depth = 1;
      auto argClose = std::next(arg);
      for (; argClose != newArgs.end() && depth; ++argClose) {
        depth += int(this->IsKeyword(keyParenL, *argClose)) -
          int(this->IsKeyword(keyParenR, *argClose));
      }
      if (depth) {
        errorString = "mismatched parenthesis in condition";
        status = MessageType::FATAL_ERROR;
        return false;
      }

      // store the reduced args in this vector
      auto argOpen = std::next(arg);
      const std::vector<cmExpandedCommandArgument> subExpr(
        argOpen, std::prev(argClose));

      // now recursively invoke IsTrue to handle the values inside the
      // parenthetical expression
      const auto value = this->IsTrue(subExpr, errorString, status);
      *arg = cmExpandedCommandArgument(bool2string(value), true);
      argOpen = std::next(arg);
      // remove the now evaluated parenthetical expression
      newArgs.erase(argOpen, argClose);
    }
  }
  return true;
}